

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

LIndex __thiscall
PlanningUnitMADPDiscrete::GetNrPolicies(PlanningUnitMADPDiscrete *this,Index agentI)

{
  size_t sVar1;
  long lVar2;
  EOverflow *this_00;
  undefined4 in_ESI;
  long *in_RDI;
  LIndex nrPolsOld;
  size_t k;
  LIndex nrPols;
  char *in_stack_ffffffffffffffa8;
  Index in_stack_ffffffffffffffcc;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffffd0;
  size_t local_20;
  ulong local_18;
  
  local_18 = 1;
  local_20 = 0;
  while( true ) {
    sVar1 = GetNrObservationHistories(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    if (local_20 == sVar1) {
      return local_18;
    }
    lVar2 = (**(code **)(*in_RDI + 0x38))(in_RDI,in_ESI);
    if (lVar2 * local_18 < local_18) break;
    local_20 = local_20 + 1;
    local_18 = lVar2 * local_18;
  }
  this_00 = (EOverflow *)__cxa_allocate_exception(0x28);
  EOverflow::EOverflow(this_00,in_stack_ffffffffffffffa8);
  __cxa_throw(this_00,&EOverflow::typeinfo,EOverflow::~EOverflow);
}

Assistant:

LIndex PlanningUnitMADPDiscrete::GetNrPolicies(Index agentI) const
{
#if 0 // don't use powl(), we want to detect overflow
    return( static_cast<LIndex>(powl( GetNrActions(agentI), 
                                      GetNrObservationHistories(agentI))));
#endif
    LIndex nrPols=1;
    for(size_t k=0;k!=GetNrObservationHistories(agentI);++k)
    {
        LIndex nrPolsOld=nrPols;
        nrPols*=GetNrActions(agentI);
        if(nrPols<nrPolsOld)
            throw(EOverflow("PlanningUnitMADPDiscrete::GetNrPolicies() overflow detected"));
    }
    return(nrPols);
}